

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

bool __thiscall
S2BooleanOperation::Impl::AddBoundary
          (Impl *this,int a_region_id,bool invert_a,bool invert_b,bool invert_result,
          vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
          *a_chain_starts,CrossingProcessor *cp)

{
  S2ShapeIndex *pSVar1;
  S2ShapeIndex *pSVar2;
  ShapeEdgeId SVar3;
  ShapeEdgeId SVar4;
  uint uVar5;
  undefined8 uVar6;
  ulong uVar7;
  S2Shape *pSVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined4 extraout_var;
  ShapeEdgeId *pSVar13;
  ulong uVar14;
  undefined4 extraout_var_00;
  int extraout_var_01;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ShapeEdgeId *pSVar18;
  ShapeEdgeId SVar19;
  bool bVar20;
  CrossingIterator next_crossing;
  ulong local_b0;
  ShapeEdgeId local_a0;
  uint local_98;
  uint local_94;
  S2LogMessage local_90;
  CrossingIterator local_80;
  S2ShapeIndex *local_50;
  ulong local_48;
  S2Shape *local_40;
  ShapeEdgeId local_38;
  
  pSVar1 = this->op_->regions_[a_region_id];
  pSVar2 = this->op_->regions_[1 - a_region_id];
  bVar9 = GetIndexCrossings(this,a_region_id);
  if (bVar9) {
    local_50 = pSVar1;
    CrossingProcessor::StartBoundary(cp,a_region_id,invert_a,invert_b,invert_result);
    pSVar18 = (a_chain_starts->
              super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_80.b_index_ = pSVar2;
    local_80.it_._M_current =
         (this->index_crossings_).
         super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_80.b_shape_id_ = -1;
    local_80.crossings_complete_ = true;
    SVar3.shape_id = ((local_80.it_._M_current)->a).shape_id;
    SVar3.edge_id = ((local_80.it_._M_current)->a).edge_id;
    if ((SVar3 != kSentinel) && (iVar10 = ((local_80.it_._M_current)->b).shape_id, iVar10 != -1)) {
      local_80.b_shape_id_ = iVar10;
      iVar10 = (*pSVar2->_vptr_S2ShapeIndex[3])(pSVar2);
      local_80.b_shape_ = (S2Shape *)CONCAT44(extraout_var,iVar10);
      local_80.b_dimension_ = (*(local_80.b_shape_)->_vptr_S2Shape[4])(local_80.b_shape_);
      local_80.b_info_.chain_id = -1;
    }
    SVar19 = (local_80.it_._M_current)->a;
    local_90.severity_ = SVar19.shape_id;
    local_90._4_4_ = SVar19.edge_id;
    uVar6 = local_90._0_8_;
    iVar10 = (*pSVar18).shape_id;
    if (SVar19.shape_id < iVar10) {
      pSVar13 = (ShapeEdgeId *)&local_90;
    }
    else {
      pSVar13 = pSVar18;
      if (SVar19.shape_id <= iVar10) {
        local_90._4_4_ = SVar19.edge_id;
        pSVar13 = (ShapeEdgeId *)&local_90;
        if ((*pSVar18).edge_id <= (int)local_90._4_4_) {
          pSVar13 = pSVar18;
        }
      }
    }
    SVar19 = *pSVar13;
    local_b0 = (ulong)SVar19 >> 0x20;
    bVar9 = SVar19.shape_id == kSentinel.shape_id;
    bVar20 = local_b0 == (ulong)kSentinel >> 0x20;
    uVar14 = CONCAT71(kSentinel._1_7_ >> 0x20,bVar20 && bVar9);
    local_90._0_8_ = uVar6;
    if (!bVar20 || !bVar9) {
      do {
        local_98 = (uint)uVar14;
        uVar14 = (ulong)SVar19 & 0xffffffff;
        iVar10 = (*local_50->_vptr_S2ShapeIndex[3])(local_50,(ulong)SVar19 & 0xffffffff);
        local_40 = (S2Shape *)CONCAT44(extraout_var_00,iVar10);
        cp->a_shape_ = local_40;
        iVar10 = (*local_40->_vptr_S2Shape[4])();
        cp->a_dimension_ = iVar10;
        local_48 = (ulong)SVar19 & 0xffffffff;
        local_94 = SVar19.shape_id;
        while( true ) {
          pSVar8 = local_40;
          uVar12 = SVar19.shape_id;
          if (uVar12 != (uint)uVar14) break;
          uVar11 = (*local_40->_vptr_S2Shape[9])(local_40,local_b0);
          iVar10 = (*pSVar8->_vptr_S2Shape[7])(pSVar8,(ulong)uVar11);
          uVar7 = local_48;
          uVar5 = local_94;
          local_38 = SVar19;
          iVar17 = extraout_var_01 + iVar10;
          bVar9 = (*pSVar18).edge_id == (uint)local_b0 && uVar12 == (*pSVar18).shape_id;
          pSVar18 = pSVar18 + bVar9;
          cp->chain_id_ = uVar11;
          uVar14 = (ulong)local_94;
          cp->chain_start_ = iVar10;
          cp->chain_limit_ = iVar17;
          cp->inside_ = bVar9;
          cp->v0_emitted_max_edge_id_ = iVar10 + -1;
          cp->chain_v0_emitted_ = false;
          uVar16 = local_b0;
          do {
            iVar10 = (int)uVar16;
            if (iVar17 <= iVar10) goto LAB_001a1229;
            if (cp->inside_ == false) {
              bVar9 = ((local_80.it_._M_current)->a).edge_id != iVar10 ||
                      uVar5 != ((local_80.it_._M_current)->a).shape_id;
            }
            else {
              bVar9 = false;
            }
            if (bVar9) {
              S2LogMessage::S2LogMessage
                        (&local_90,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                         ,0x6e5,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_90.stream_,
                         "Check failed: cp->inside() || next_crossing.a_id() == a_id ",0x3b);
              if (bVar9) {
                abort();
              }
            }
            bVar9 = CrossingProcessor::ProcessEdge
                              (cp,(ShapeEdgeId)(uVar16 << 0x20 | uVar7),&local_80);
            iVar15 = 1;
            if (bVar9) {
              if (cp->inside_ == true) {
                uVar16 = (ulong)(iVar10 + 1);
                iVar15 = 0;
              }
              else {
                SVar19 = (local_80.it_._M_current)->a;
                iVar15 = 7;
                if (uVar5 == SVar19.shape_id) {
                  if (SVar19.edge_id < iVar17) {
                    uVar16 = (ulong)SVar19 >> 0x20;
                  }
                  iVar15 = 7;
                  if (SVar19.edge_id < iVar17) {
                    iVar15 = 0;
                  }
                }
              }
            }
          } while (iVar15 == 0);
          if (iVar15 == 7) {
LAB_001a1229:
            local_a0 = (local_80.it_._M_current)->a;
            SVar4 = local_a0;
            iVar10 = (*pSVar18).shape_id;
            pSVar13 = &local_a0;
            if ((iVar10 <= local_a0.shape_id) && (pSVar13 = pSVar18, local_a0.shape_id <= iVar10)) {
              if (local_a0.edge_id < (*pSVar18).edge_id) {
                pSVar13 = &local_a0;
              }
            }
            local_b0 = (ulong)*pSVar13 >> 0x20;
            bVar9 = true;
            SVar19 = *pSVar13;
            local_a0 = SVar4;
          }
          else {
            bVar9 = false;
            SVar19 = local_38;
          }
          if (!bVar9) {
            uVar14 = (ulong)local_98;
            goto LAB_001a12b8;
          }
        }
        uVar12 = kSentinel.edge_id ^ (uint)local_b0 | uVar12 ^ kSentinel.shape_id;
        uVar14 = (ulong)CONCAT31((int3)(uVar12 >> 8),uVar12 == 0);
      } while (uVar12 != 0);
    }
  }
  else {
    uVar14 = 0;
  }
LAB_001a12b8:
  return (bool)((byte)uVar14 & 1);
}

Assistant:

bool S2BooleanOperation::Impl::AddBoundary(
    int a_region_id, bool invert_a, bool invert_b, bool invert_result,
    const vector<ShapeEdgeId>& a_chain_starts, CrossingProcessor* cp) {
  const S2ShapeIndex& a_index = *op_->regions_[a_region_id];
  const S2ShapeIndex& b_index = *op_->regions_[1 - a_region_id];
  if (!GetIndexCrossings(a_region_id)) return false;
  cp->StartBoundary(a_region_id, invert_a, invert_b, invert_result);

  // Walk the boundary of region A and build a list of all edge crossings.
  // We also keep track of whether the current vertex is inside region B.
  auto next_start = a_chain_starts.begin();
  CrossingIterator next_crossing(&b_index, &index_crossings_,
                                 true /*crossings_complete*/);
  ShapeEdgeId next_id = min(*next_start, next_crossing.a_id());
  while (next_id != kSentinel) {
    int a_shape_id = next_id.shape_id;
    const S2Shape& a_shape = *a_index.shape(a_shape_id);
    cp->StartShape(&a_shape);
    while (next_id.shape_id == a_shape_id) {
      // TODO(ericv): Special handling of dimension 0?  Can omit most of this
      // code, including the loop, since all chains are of length 1.
      int edge_id = next_id.edge_id;
      S2Shape::ChainPosition chain_position = a_shape.chain_position(edge_id);
      int chain_id = chain_position.chain_id;
      S2Shape::Chain chain = a_shape.chain(chain_id);
      bool start_inside = (next_id == *next_start);
      if (start_inside) ++next_start;
      cp->StartChain(chain_id, chain, start_inside);
      int chain_limit = chain.start + chain.length;
      while (edge_id < chain_limit) {
        ShapeEdgeId a_id(a_shape_id, edge_id);
        S2_DCHECK(cp->inside() || next_crossing.a_id() == a_id);
        if (!cp->ProcessEdge(a_id, &next_crossing)) {
          return false;
        }
        if (cp->inside()) {
          ++edge_id;
        } else if (next_crossing.a_id().shape_id == a_shape_id &&
                   next_crossing.a_id().edge_id < chain_limit) {
          edge_id = next_crossing.a_id().edge_id;
        } else {
          break;
        }
      }
      next_id = min(*next_start, next_crossing.a_id());
    }
  }
  return true;
}